

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void __thiscall Engine::makeDecision(Engine *this,DecInfo *di,int alt)

{
  uint uVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  IntVar *this_00;
  int alt_local;
  key_type local_1c0 [4];
  stringstream ss;
  ostream local_190 [376];
  
  this->nodes = this->nodes + 1;
  alt_local = alt;
  std::vector<int,_std::allocator<int>_>::push_back(&altpath,&alt_local);
  this_00 = (IntVar *)di->var;
  if (this_00 == (IntVar *)0x0) {
    if ((so.print_nodes != false) || (profilerConnector->_connected == true)) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      getLitString_abi_cxx11_(alt_local);
      std::operator<<(local_190,(string *)local_1c0);
      std::__cxx11::string::~string((string *)local_1c0);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&mostRecentLabel_abi_cxx11_,(string *)local_1c0);
      std::__cxx11::string::~string((string *)local_1c0);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    SAT::enqueue(&sat,(Lit)(alt_local ^ di->val),(Reason)0x0);
  }
  else {
    if ((so.print_nodes != false) || (profilerConnector->_connected == true)) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      local_1c0[0] = (key_type)di->var;
      pmVar2 = std::
               map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&intVarString_abi_cxx11_,local_1c0);
      std::operator<<(local_190,(string *)pmVar2);
      uVar1 = di->type - 1;
      if (uVar1 < 3) {
        pcVar3 = &DAT_001b1404 + *(int *)(&DAT_001b1404 + (ulong)uVar1 * 4);
      }
      else {
        pcVar3 = "?=";
      }
      std::operator<<(local_190,pcVar3);
      std::ostream::operator<<((ostream *)local_190,di->val);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&mostRecentLabel_abi_cxx11_,(string *)local_1c0);
      std::__cxx11::string::~string((string *)local_1c0);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      this_00 = (IntVar *)di->var;
    }
    IntVar::set(this_00,di->val,alt_local ^ di->type,true);
  }
  if (((so.ldsb == true) && (di->var != (void *)0x0)) && (di->type == 1)) {
    LDSB::processDec(&ldsb,(Lit)(sat.trail.data[sat.trail.sz - 1].data)->x);
  }
  return;
}

Assistant:

inline void Engine::makeDecision(DecInfo& di, int alt) {
	++nodes;
	altpath.push_back(alt);
#ifdef HAS_VAR_IMPACT
	vec<int> sizes(0);
	if (last_int) last_int->updateImpact(processImpact(var_sizes, getVarSizes(sizes)));
#endif
	if (di.var != nullptr) {
#if DEBUG_VERBOSE
		std::cerr << "makeDecision: " << intVarString[(IntVar*)di.var] << " / " << di.val << " (" << alt
							<< ")" << std::endl;
#endif
#ifdef HAS_PROFILER
		if (doProfiling()) {
			std::stringstream ss;
			/* ss << intVarString[(IntVar*)di.var] << " / " << di.val << " (" << alt << ")"; */
			ss << intVarString[(IntVar*)di.var];
			switch (di.type) {
				case 1:
					ss << "==";
					break;
				case 2:
					ss << ">=";
					break;
				case 3:
					ss << "<=";
					break;
				default:
					ss << "?=";
					break;
			}
			ss << di.val;
			mostRecentLabel = ss.str();
		}
#endif
#ifdef HAS_VAR_IMPACT
		last_int = (IntVar*)di.var;
		if (sizes.size())
			sizes.moveTo(var_sizes);
		else
			getVarSizes(var_sizes);
#endif
		((IntVar*)di.var)->set(di.val, static_cast<LitRel>(di.type ^ alt));
	} else {
#if DEBUG_VERBOSE
		std::cerr << "enqueuing SAT literal: " << di.val << "^" << alt << " = " << (di.val ^ alt)
							<< std::endl;
#endif
#ifdef HAS_PROFILER
		if (doProfiling()) {
			std::stringstream ss;
			ss << getLitString(di.val ^ alt);
			mostRecentLabel = ss.str();
		}
#endif
#ifdef HAS_VAR_IMPACT
		last_int = nullptr;
#endif
		sat.enqueue(toLit(di.val ^ alt));
	}
	if (so.ldsb && (di.var != nullptr) && di.type == 1) {
		ldsb.processDec(sat.trail.last()[0]);
	}
	//  if (opt_var && di.var == opt_var && ((IntVar*) di.var)->isFixed()) printf("objective = %d\n",
	//  ((IntVar*) di.var)->getVal());
}